

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentRunner.h
# Opt level: O0

void __thiscall
aeron::concurrent::AgentRunner<aeron::ClientConductor,_aeron::concurrent::SleepingIdleStrategy>::run
          (AgentRunner<aeron::ClientConductor,_aeron::concurrent::SleepingIdleStrategy> *this)

{
  SleepingIdleStrategy *this_00;
  bool bVar1;
  int workCount;
  undefined8 *in_RDI;
  SourcedException *exception;
  SourcedException *exception_1;
  
  ClientConductor::onStart((ClientConductor *)*in_RDI);
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)(in_RDI + 3));
    if (!bVar1) break;
    this_00 = (SleepingIdleStrategy *)in_RDI[1];
    workCount = ClientConductor::doWork((ClientConductor *)*in_RDI);
    SleepingIdleStrategy::idle(this_00,workCount);
  }
  ClientConductor::onClose((ClientConductor *)*in_RDI);
  return;
}

Assistant:

inline void run()
    {
        try
        {
            m_agent.onStart();
        }
        catch (const util::SourcedException &exception)
        {
            m_exceptionHandler(exception);
            m_running = false;
        }

        while (m_running)
        {
            try
            {
                m_idleStrategy.idle(m_agent.doWork());
            }
            catch (const util::SourcedException &exception)
            {
                m_exceptionHandler(exception);
            }
        }

        try
        {
            m_agent.onClose();
        }
        catch (const util::SourcedException &exception)
        {
            m_exceptionHandler(exception);
        }
    }